

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereSurface.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  double local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string fileName;
  ofstream outfile;
  stringstream ss;
  long local_1a0;
  undefined8 local_198 [2];
  uint auStack_188 [88];
  
  iVar2 = 1;
  local_458 = 0.5;
  while( true ) {
    while (iVar1 = getopt(argc,argv,"r:p:"), iVar1 == 0x70) {
      iVar2 = atoi(_optarg);
    }
    if (iVar1 == -1) {
      switch(iVar2) {
      case 0:
        argv = (char **)operator_new(0xb0);
        Rectangular::Rectangular((Rectangular *)argv,local_458);
        break;
      case 1:
        argv = (char **)operator_new(0xf0);
        Spherical::Spherical((Spherical *)argv,local_458);
        break;
      case 2:
        argv = (char **)operator_new(0xb0);
        BoxProjection::BoxProjection((BoxProjection *)argv,local_458);
        break;
      case 3:
        argv = (char **)operator_new(0xf0);
        YinYang::YinYang((YinYang *)argv,local_458);
        break;
      case 4:
        argv = (char **)operator_new(0x138);
        TwoCaps::TwoCaps((TwoCaps *)argv,local_458);
      }
      std::operator<<((ostream *)&std::cout,">>> Starting SphereSurface <<<\n");
      std::operator<<((ostream *)&std::cout,"Sphere Radius = ");
      poVar3 = std::ostream::_M_insert<double>((((TwoCaps *)argv)->super_Parameterization).radius);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"Using Parameterization = ");
      Parameterization::GetName_abi_cxx11_((string *)&outfile,(Parameterization *)argv);
      poVar3 = std::operator<<(poVar3,(string *)&outfile);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&outfile);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 2;
      std::ostream::_M_insert<double>((((TwoCaps *)argv)->super_Parameterization).radius);
      Parameterization::GetName_abi_cxx11_(&local_430,(Parameterization *)argv);
      std::operator+(&local_410,"SphereSurf-",&local_430);
      std::operator+(&local_3f0,&local_410,"-r");
      std::__cxx11::stringbuf::str();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outfile,
                     &local_3f0,&local_450);
      std::operator+(&fileName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outfile,
                     ".xyz");
      std::__cxx11::string::~string((string *)&outfile);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::ofstream::ofstream(&outfile);
      std::ofstream::open((string *)&outfile,(_Ios_Openmode)&fileName);
      (*(((TwoCaps *)argv)->super_Parameterization)._vptr_Parameterization[1])(argv,&outfile);
      std::ofstream::close();
      std::operator<<((ostream *)&std::cout,"\n>>> SphereSurface Mesh File Complete <<<\n");
      std::ofstream::~ofstream(&outfile);
      std::__cxx11::string::~string((string *)&fileName);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return 0;
    }
    if (iVar1 == 0x3f) {
      if (_optopt == 99) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Option -");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,_optopt);
        poVar3 = std::operator<<(poVar3," requires an argument.");
      }
      else {
        iVar2 = isprint(_optopt);
        if (iVar2 == 0) {
          pcVar4 = "Unknown option character ";
        }
        else {
          pcVar4 = "Unknown option -";
        }
        poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,_optopt);
      }
      std::endl<char,std::char_traits<char>>(poVar3);
      return 1;
    }
    if (iVar1 != 0x72) break;
    local_458 = strtod(_optarg,(char **)0x0);
  }
  abort();
}

Assistant:

int main(int argc, char **argv)
{
  Parameterization* param;
  double radius = 0.5e0;
  int coordinates = SPHERICAL;
  int c;

  // Parsing command line arguments with getopt
  while ((c = getopt(argc, argv, "r:p:")) != -1) {
    switch (c) {
      case 'r':
        radius = strtod(optarg, NULL);
        break;
      case 'p':
        coordinates = atoi(optarg);
        break;
      case '?':
        if (optopt == 'c')
          cout << "Option -" << optopt << " requires an argument." << endl;
        else if (isprint (optopt))
          cout << "Unknown option -" << optopt << endl;
        else
          cout << "Unknown option character " << optopt << endl;
        return 1;
      default:
        abort();
    }
  }

  switch (coordinates) {
    case RECTANGULAR:
      param = new Rectangular(radius);
      break;
    case SPHERICAL:
      param = new Spherical(radius);
      break;
    case BOX_PROJECTION:
      param = new BoxProjection(radius);
      break;
    case YIN_YANG:
      param = new YinYang(radius);
      break;
    case TWO_CAPS:
      param = new TwoCaps(radius);
      break;
  }

  // Initial log to console.
  cout << ">>> Starting SphereSurface <<<\n";
  cout << "Sphere Radius = " << param->radius << endl;
  cout << "Using Parameterization = " << param->GetName() << endl;


  // Open file to write.
  stringstream ss;
  ss << fixed << setprecision(2) << param->radius;
  string fileName = "SphereSurf-" + param->GetName() + "-r" + ss.str() + ".xyz";
  ofstream outfile;
  outfile.open(fileName);

  param->PrintPlot3D(outfile);

  outfile.close();

  cout << "\n>>> SphereSurface Mesh File Complete <<<\n";

  return 0;
}